

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::fixBlockUniformOffsets
          (TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  TSourceLoc *pTVar8;
  int powerOf2;
  ulong uVar9;
  ulong uVar10;
  int offset;
  int memberSize;
  int dummyStride;
  int local_4c;
  TParseContext *local_48;
  TQualifier *local_40;
  int local_38;
  int local_34;
  long lVar6;
  
  if (((((*(ulong *)&qualifier->field_0x8 >> 0x2b & 1) != 0) ||
       (((uint)*(ulong *)&qualifier->field_0x8 & 0x7f) - 5 < 3)) &&
      (uVar2 = (byte)qualifier->field_0x10 & 0xf, uVar2 < 6)) && ((0x2cU >> uVar2 & 1) != 0)) {
    local_4c = 0;
    pTVar5 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
             ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      uVar9 = 0;
      uVar10 = 1;
      local_48 = this;
      local_40 = qualifier;
      do {
        iVar3 = (*(pTVar5[uVar9].type)->_vptr_TType[10])();
        lVar6 = CONCAT44(extraout_var,iVar3);
        pTVar5 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar3 = (*(pTVar5[uVar9].type)->_vptr_TType[10])();
        uVar7 = *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8);
        if (uVar7 < 0x2000000000000000) {
          uVar7 = *(ulong *)&local_40->field_0x8;
        }
        iVar4 = TIntermediate::getMemberAlignment
                          ((typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar9].type,&local_38,&local_34
                           ,(byte)local_40->field_0x10 & 0xf,
                           (uVar7 & 0xe000000000000000) == 0x2000000000000000);
        iVar3 = local_4c;
        if (*(int *)(lVar6 + 0x14) != -1) {
          pTVar8 = &pTVar5[uVar9].loc;
          bVar1 = IsMultipleOfPow2<int>(*(int *)(lVar6 + 0x14),iVar4);
          if (!bVar1) {
            (*(local_48->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_48,pTVar8,"must be a multiple of the member\'s alignment","offset",
                       "(layout offset = %d | member alignment = %d)",(ulong)*(uint *)(lVar6 + 0x14)
                       ,iVar4);
          }
          iVar3 = *(int *)(lVar6 + 0x14);
          if ((local_48->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
            if (iVar3 < local_4c) {
              (*(local_48->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (local_48,pTVar8,"cannot lie in previous members","offset","");
              iVar3 = *(int *)(lVar6 + 0x14);
            }
            if (iVar3 < local_4c) {
              iVar3 = local_4c;
            }
          }
        }
        local_4c = iVar3;
        iVar3 = *(int *)(lVar6 + 0x18);
        powerOf2 = iVar3;
        if (iVar3 < iVar4) {
          powerOf2 = iVar4;
        }
        if (iVar3 == -1) {
          powerOf2 = iVar4;
        }
        RoundToPow2<int>(&local_4c,powerOf2);
        iVar3 = local_4c;
        iVar4 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].type)->_vptr_TType[10])();
        *(int *)(CONCAT44(extraout_var_01,iVar4) + 0x14) = iVar3;
        local_4c = local_4c + local_38;
        pTVar5 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar10 < (ulong)((long)(typeList->
                                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ).
                                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >>
                                5);
        uVar9 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    if (!storageCanHaveLayoutInBlock(qualifier.storage) && !qualifier.isTaskMemory())
        return;
    if (qualifier.layoutPacking != ElpStd140 && qualifier.layoutPacking != ElpStd430 && qualifier.layoutPacking != ElpScalar)
        return;

    int offset = 0;
    int memberSize;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;

        // "When align is applied to an array, it effects only the start of the array, not the array's internal stride."

        // modify just the children's view of matrix layout, if there is one for this member
        TLayoutMatrix subMatrixLayout = typeList[member].type->getQualifier().layoutMatrix;
        int dummyStride;
        int memberAlignment = intermediate.getMemberAlignment(*typeList[member].type, memberSize, dummyStride, qualifier.layoutPacking,
                                                              subMatrixLayout != ElmNone ? subMatrixLayout == ElmRowMajor : qualifier.layoutMatrix == ElmRowMajor);
        if (memberQualifier.hasOffset()) {
            // "The specified offset must be a multiple
            // of the base alignment of the type of the block member it qualifies, or a compile-time error results."
            if (! IsMultipleOfPow2(memberQualifier.layoutOffset, memberAlignment))
                error(memberLoc, "must be a multiple of the member's alignment", "offset",
                    "(layout offset = %d | member alignment = %d)", memberQualifier.layoutOffset, memberAlignment);

            // GLSL: "It is a compile-time error to specify an offset that is smaller than the offset of the previous
            // member in the block or that lies within the previous member of the block"
            if (spvVersion.spv == 0) {
                if (memberQualifier.layoutOffset < offset)
                    error(memberLoc, "cannot lie in previous members", "offset", "");

                // "The offset qualifier forces the qualified member to start at or after the specified
                // integral-constant expression, which will be its byte offset from the beginning of the buffer.
                // "The actual offset of a member is computed as
                // follows: If offset was declared, start with that offset, otherwise start with the next available offset."
                offset = std::max(offset, memberQualifier.layoutOffset);
            } else {
                // TODO: Vulkan: "It is a compile-time error to have any offset, explicit or assigned,
                // that lies within another member of the block."

                offset = memberQualifier.layoutOffset;
            }
        }

        // "The actual alignment of a member will be the greater of the specified align alignment and the standard
        // (e.g., std140) base alignment for the member's type."
        if (memberQualifier.hasAlign())
            memberAlignment = std::max(memberAlignment, memberQualifier.layoutAlign);

        // "If the resulting offset is not a multiple of the actual alignment,
        // increase it to the first offset that is a multiple of
        // the actual alignment."
        RoundToPow2(offset, memberAlignment);
        typeList[member].type->getQualifier().layoutOffset = offset;
        offset += memberSize;
    }
}